

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

string * __thiscall
xla::GraphCycles::DebugString_abi_cxx11_(string *__return_storage_ptr__,GraphCycles *this)

{
  int __val;
  pointer pNVar1;
  int *piVar2;
  bool bVar3;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *puVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  undefined8 extraout_RDX_01;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *set;
  int *piVar6;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> free_nodes_set;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a8;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::
  _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_a8,
             (this->rep_->free_nodes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->rep_->free_nodes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish,0,&local_e8,&local_108,&local_128);
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,"digraph {\n",(allocator *)&local_e8);
  puVar4 = (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
           ((long)(this->rep_->nodes_).
                  super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->rep_->nodes_).
                  super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  set = (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)0x0;
  if ((long)puVar4 < 1) {
    puVar4 = set;
  }
  uVar5 = extraout_RDX;
  for (; set != puVar4;
      set = (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
            ((long)&(set->_M_h)._M_buckets + 1)) {
    bVar3 = anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&local_a8,set,(int32_t)uVar5);
    uVar5 = extraout_RDX_00;
    if (bVar3) {
      pNVar1 = (this->rep_->node_io_).
               super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar2 = *(pointer *)
                ((long)&pNVar1[(long)set].out.value_sequence_.
                        super__Vector_base<int,_std::allocator<int>_> + 8);
      for (piVar6 = *(int **)&pNVar1[(long)set].out.value_sequence_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl;
          piVar6 != piVar2; piVar6 = piVar6 + 1) {
        __val = *piVar6;
        std::__cxx11::to_string(&local_c8,(long)set);
        std::operator+(&local_50,"  \"",&local_c8);
        std::operator+(&local_128,&local_50,"\" -> \"");
        std::__cxx11::to_string(&local_70,__val);
        std::operator+(&local_108,&local_128,&local_70);
        std::operator+(&local_e8,&local_108,"\"\n");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_c8);
        uVar5 = extraout_RDX_01;
      }
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::string GraphCycles::DebugString() const {
  std::unordered_set<int32_t> free_nodes_set(rep_->free_nodes_.begin(),
                                              rep_->free_nodes_.end());

  std::string result = "digraph {\n";
  for (int64_t i = 0, end = rep_->nodes_.size(); i < end; i++) {
    int32_t index = static_cast<int32_t>(i);
    if (!contains(free_nodes_set, index)) {
      continue;
    }

    for (int32_t succ : rep_->node_io_[i].out.GetSequence()) {
      result += "  \"" + std::to_string(i) + "\" -> \"" + std::to_string(succ) + "\"\n";
    }
  }

  result += "}\n";

  return result;
}